

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O2

void ON_Mesh_SetClosedHelper
               (bool bClosedOnly,ON_Mesh *mesh,char *m_mesh_is_manifold,char *m_mesh_is_oriented)

{
  uint uVar1;
  uint uVar2;
  byte bVar3;
  char cVar4;
  uint *puVar5;
  uint *memblock;
  ON_MeshFace *pOVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  char cVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  bool bVar21;
  bool bVar22;
  uint Vidbuffer [256];
  
  uVar8 = (mesh->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
  uVar14 = (mesh->m_F).m_count;
  uVar7 = (ulong)uVar14;
  if (uVar8 < 3 || uVar7 == 0) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_mesh.cpp"
               ,0xe8b,"","Mesh is not valid.");
  }
  else {
    if ((!bClosedOnly) || (3 < uVar14 && 3 < uVar8)) {
      uVar10 = 0;
      puVar5 = (uint *)0x0;
      if (uVar8 < 0x101) {
        puVar5 = Vidbuffer;
      }
      puVar5 = ON_Mesh::GetVertexLocationIds(mesh,1,puVar5,(uint *)0x0);
      if (puVar5 == (uint *)0x0) {
        uVar8 = 0;
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_mesh.cpp"
                   ,0xe9d,"","Mesh has corrupt vertex information.");
        cVar4 = '\x02';
        cVar17 = '\x02';
        bClosedOnly = false;
      }
      else {
        memblock = (uint *)onmalloc((ulong)(uVar14 * 4) * 0xc);
        pOVar6 = (mesh->m_F).m_a;
        for (uVar18 = 0; uVar9 = uVar7, uVar11 = uVar10, uVar7 != uVar18; uVar18 = uVar18 + 1) {
          uVar8 = puVar5[pOVar6->vi[0]];
          uVar12 = puVar5[pOVar6->vi[1]];
          uVar9 = uVar18;
          if (uVar8 == uVar12) break;
          uVar11 = uVar12;
          if (uVar12 < uVar8) {
            uVar11 = uVar8;
          }
          uVar1 = uVar8;
          if (uVar12 <= uVar8) {
            uVar1 = uVar12;
          }
          uVar20 = (ulong)uVar10;
          memblock[uVar20 * 3] = uVar1;
          memblock[uVar20 * 3 + 1] = uVar11;
          memblock[uVar20 * 3 + 2] = (uint)(uVar12 <= uVar8 && uVar8 != uVar12);
          uVar8 = puVar5[pOVar6->vi[2]];
          uVar11 = uVar10 + 1;
          if (uVar12 == uVar8) break;
          uVar1 = uVar8;
          if (uVar8 < uVar12) {
            uVar1 = uVar12;
          }
          uVar2 = uVar12;
          if (uVar8 <= uVar12) {
            uVar2 = uVar8;
          }
          uVar11 = uVar10 + 2;
          uVar20 = (ulong)(uVar10 + 1);
          memblock[uVar20 * 3] = uVar2;
          memblock[uVar20 * 3 + 1] = uVar1;
          memblock[uVar20 * 3 + 2] = (uint)(uVar8 <= uVar12 && uVar12 != uVar8);
          if (pOVar6->vi[2] != pOVar6->vi[3]) {
            uVar12 = puVar5[pOVar6->vi[3]];
            if (uVar8 == uVar12) break;
            uVar1 = uVar12;
            if (uVar12 < uVar8) {
              uVar1 = uVar8;
            }
            uVar2 = uVar8;
            if (uVar12 <= uVar8) {
              uVar2 = uVar12;
            }
            uVar20 = (ulong)uVar11;
            memblock[uVar20 * 3] = uVar2;
            memblock[uVar20 * 3 + 1] = uVar1;
            memblock[uVar20 * 3 + 2] = (uint)(uVar12 <= uVar8 && uVar8 != uVar12);
            uVar8 = uVar12;
            uVar11 = uVar10 + 3;
          }
          uVar20 = (ulong)uVar11;
          uVar12 = puVar5[pOVar6->vi[0]];
          bVar21 = uVar12 <= uVar8;
          bVar22 = uVar8 == uVar12;
          if (bVar22) break;
          uVar1 = uVar12;
          if (bVar21 && !bVar22) {
            uVar1 = uVar8;
          }
          if (!bVar21) {
            uVar12 = uVar8;
          }
          uVar10 = uVar11 + 1;
          memblock[uVar20 * 3] = uVar12;
          memblock[uVar20 * 3 + 1] = uVar1;
          memblock[uVar20 * 3 + 2] = (uint)(bVar21 && !bVar22);
          pOVar6 = pOVar6 + 1;
        }
        if (puVar5 != Vidbuffer) {
          onfree(puVar5);
        }
        if (((uint)uVar9 == uVar14) && (2 < uVar11)) {
          uVar18 = (ulong)uVar11;
          uVar9 = (ulong)(uVar11 >> 1);
          uVar7 = uVar18 - 1;
LAB_005173ab:
          if (uVar9 == 0) {
            uVar8 = memblock[uVar7 * 3];
            uVar10 = memblock[uVar7 * 3 + 1];
            uVar12 = memblock[uVar7 * 3 + 2];
            *(undefined8 *)(memblock + uVar7 * 3) = *(undefined8 *)memblock;
            memblock[uVar7 * 3 + 2] = memblock[2];
            uVar7 = uVar7 - 1;
            if (uVar7 == 0) goto LAB_005174d1;
            uVar9 = 0;
          }
          else {
            uVar9 = uVar9 - 1;
            uVar8 = memblock[uVar9 * 3];
            uVar10 = memblock[uVar9 * 3 + 1];
            uVar12 = memblock[uVar9 * 3 + 2];
          }
          uVar20 = uVar7 + 1;
          uVar19 = uVar9;
          do {
            uVar15 = uVar19 * 2 + 1;
            do {
              if (uVar7 < uVar15) {
                memblock[uVar19 * 3] = uVar8;
                memblock[uVar19 * 3 + 1] = uVar10;
                memblock[uVar19 * 3 + 2] = uVar12;
                goto LAB_005173ab;
              }
              uVar16 = uVar15;
              if (uVar15 < uVar7) {
                if (memblock[uVar15 * 3] < memblock[uVar15 * 3 + 3]) {
LAB_00517422:
                  uVar16 = uVar15 + 1;
                }
                else if (memblock[uVar15 * 3] == memblock[uVar15 * 3 + 3]) {
                  if ((memblock[uVar15 * 3 + 1] < memblock[uVar15 * 3 + 4]) ||
                     ((memblock[uVar15 * 3 + 1] == memblock[uVar15 * 3 + 4] &&
                      (memblock[uVar15 * 3 + 2] < memblock[uVar15 * 3 + 5])))) goto LAB_00517422;
                }
              }
              puVar5 = memblock + uVar16 * 3;
            } while ((memblock[uVar16 * 3] <= uVar8) &&
                    ((uVar15 = uVar20, uVar8 != memblock[uVar16 * 3] ||
                     ((puVar5[1] <= uVar10 && ((uVar10 != puVar5[1] || (puVar5[2] <= uVar12))))))));
            memblock[uVar19 * 3 + 2] = puVar5[2];
            *(undefined8 *)(memblock + uVar19 * 3) = *(undefined8 *)puVar5;
            uVar19 = uVar16;
          } while( true );
        }
        uVar8 = 0;
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_mesh.cpp"
                   ,0xef1,"","Mesh is corrupt or collapsed");
        cVar4 = '\x02';
        cVar17 = '\x02';
        bClosedOnly = false;
      }
      goto LAB_00517658;
    }
    bClosedOnly = true;
  }
  uVar8 = 0;
  cVar4 = '\x02';
  cVar17 = '\x02';
  goto LAB_00517658;
LAB_005174d1:
  *memblock = uVar8;
  memblock[1] = uVar10;
  memblock[2] = uVar12;
  bVar21 = 5 < uVar11 && 3 < uVar14;
  uVar14 = (uint)bVar21;
  uVar8 = (uint)bVar21;
  if ((!bClosedOnly) || (bVar21)) {
    cVar4 = '\x01';
    uVar7 = 0;
    bVar3 = 0;
    cVar17 = cVar4;
    while( true ) {
      do {
        uVar10 = (uint)uVar7;
        puVar5 = memblock + (uVar7 & 0xffffffff) * 3 + 5;
        uVar12 = uVar10 + 3;
        uVar9 = uVar7 & 0xffffffff;
        while( true ) {
          uVar8 = uVar14;
          if (uVar18 <= uVar9) {
            uVar20 = uVar7 & 0xffffffff;
            if (uVar10 <= uVar11) {
              uVar20 = (ulong)uVar11;
            }
            goto LAB_00517644;
          }
          uVar20 = uVar9 + 1;
          if (uVar18 <= uVar20) {
            uVar8 = uVar10 + 1;
            if (uVar10 + 1 < uVar11) {
              uVar8 = uVar11;
            }
            uVar20 = (ulong)uVar8;
            uVar8 = 0;
            goto LAB_00517644;
          }
          uVar1 = puVar5[-5];
          iVar13 = (int)uVar9;
          if ((uVar1 == puVar5[-2]) && (uVar2 = puVar5[-4], uVar2 == puVar5[-1])) break;
          if ((bool)(cVar4 == '\x02' & bVar3)) {
            uVar14 = iVar13 + 1;
            goto LAB_00517632;
          }
          puVar5 = puVar5 + 3;
          uVar12 = uVar12 + 1;
          uVar8 = 0;
          uVar9 = uVar20;
          uVar14 = 0;
          if (bClosedOnly) {
            bClosedOnly = true;
            goto LAB_00517644;
          }
        }
        if (puVar5[-3] == *puVar5) {
          cVar4 = '\x02';
        }
        uVar10 = iVar13 + 2;
        uVar7 = (ulong)uVar10;
        uVar14 = uVar8;
      } while (((uVar11 <= uVar10) || (uVar1 != memblock[(ulong)uVar10 * 3])) ||
              (uVar2 != memblock[(ulong)uVar10 * 3 + 1]));
      if (uVar8 == 0) break;
      uVar7 = (ulong)(iVar13 + 3);
      puVar5 = memblock + (ulong)uVar12 * 3 + 1;
      while( true ) {
        cVar4 = '\x02';
        bVar3 = 1;
        if (uVar18 <= uVar7) break;
        if ((uVar1 != puVar5[-1]) || (uVar2 != *puVar5)) goto LAB_00517607;
        uVar7 = uVar7 + 1;
        puVar5 = puVar5 + 3;
      }
      uVar7 = (ulong)uVar11;
LAB_00517607:
      uVar14 = 1;
      cVar17 = cVar4;
    }
    uVar14 = iVar13 + 2;
LAB_00517632:
    uVar8 = 0;
    cVar4 = '\x02';
    uVar20 = (ulong)uVar14;
    cVar17 = '\x02';
    bClosedOnly = false;
  }
  else {
    cVar4 = '\x01';
    uVar20 = 0;
    cVar17 = '\x01';
  }
LAB_00517644:
  bClosedOnly = (bool)((uint)uVar20 < uVar11 & bClosedOnly);
  onfree(memblock);
LAB_00517658:
  ON_Mesh::SetClosed(mesh,uVar8);
  if (bClosedOnly == false) {
    if (cVar17 == '\x02') {
      cVar4 = '\x02';
    }
    *m_mesh_is_manifold = cVar17;
    *m_mesh_is_oriented = cVar4;
  }
  return;
}

Assistant:

static void ON_Mesh_SetClosedHelper( 
          bool bClosedOnly,
          const ON_Mesh& mesh,
          const char& m_mesh_is_manifold,
          const char& m_mesh_is_oriented
          )
{
  // thread safe lazy evaluation for mesh's m_mesh_is_... flags
  // Sets: m_mesh_is_closed.
  //       If bClosedOnly is false, also sets m_mesh_is_manifold and m_mesh_is_oriented
  int is_closed = 0;
  char is_manifold = 2;
  char is_oriented = 2;
  for (;;)
  {
    const unsigned int Vcount = mesh.m_V.UnsignedCount();
    const unsigned int Fcount = mesh.m_F.UnsignedCount();
    if ( Vcount < 3 || Fcount < 1 )
    {
      ON_ERROR("Mesh is not valid.");
      break;
    }
    if ( bClosedOnly && (Vcount < 4 || Fcount < 4) )
    {
      // not closed - don't waste any more time.
      break;
    }

    unsigned int i, j;
    unsigned int Vidbuffer[256];
    unsigned int* Vid = mesh.GetVertexLocationIds(
                     1,
                     (Vcount*sizeof(*Vid) <= sizeof(Vidbuffer) ? &Vidbuffer[0] : nullptr),
                     nullptr // unwanted Vindex[] values
                    );
    if ( 0 == Vid )
    {
      ON_ERROR("Mesh has corrupt vertex information.");
      bClosedOnly = false;
      break;
    }

    // build an edge list where the "vertex" indices identify unique 3d locations
    ON_3udex* E_list = (ON_3udex*)onmalloc(4 * Fcount*sizeof(E_list[0]));
    ON_3udex E;
    unsigned int Vid0;
    const int* fvi;
    unsigned int E_count = 0;
    const ON_MeshFace* F = mesh.m_F.Array();
    for ( j = 0; j < Fcount; j++ )
    {
      fvi = F[j].vi;
      E.i = Vid[fvi[0]];
      Vid0 = E.j = Vid[fvi[1]];
      if ( E.i == E.j )
        break;
      if ( E.i > E.j )
      {
        i = E.i; E.i = E.j; E.j = i;
        E.k = 1;
      }
      else
      {
        E.k = 0;
      }
      E_list[E_count++] = E;

      E.i = Vid0;
      Vid0 = E.j = Vid[fvi[2]];
      if ( E.i == E.j )
        break;
      if ( E.i > E.j )
      {
        i = E.i; E.i = E.j; E.j = i;
        E.k = 1;
      }
      else
      {
        E.k = 0;
      }
      E_list[E_count++] = E;

      if ( fvi[2] != fvi[3] )
      {
        // quad
        E.i = Vid0;
        Vid0 = E.j = Vid[fvi[3]];
        if ( E.i == E.j )
          break;
        if ( E.i > E.j )
        {
          i = E.i; E.i = E.j; E.j = i;
          E.k = 1;
        }
        else
        {
          E.k = 0;
        }
        E_list[E_count++] = E;
      }

      E.i = Vid0;
      E.j = Vid[fvi[0]];
      if ( E.i == E.j )
        break;
      if ( E.i > E.j )
      {
        i = E.i; E.i = E.j; E.j = i;
        E.k = 1;
      }
      else
      {
        E.k = 0;
      }
      E_list[E_count++] = E;
    }
    if ( Vid != &Vidbuffer[0] )
      onfree(Vid);

    if ( E_count < 3 || j != Fcount )
    {
      ON_ERROR("Mesh is corrupt or collapsed");
      bClosedOnly = false;
      break;
    }

    // sort the the edges
    ON_hsort_3udex(E_list,E_count);

    // Look for duplicate edges.  If we find an edge with no duplicate,
    // then the mesh is open.  It is possible that degenerate meshes,
    // like a flattened box, will be flagged as closed.
    is_closed = (Fcount >= 4 && E_count >= 6) ? 1 : 0;
    is_oriented = 1;
    is_manifold = 1;
    i = 0;
    if ( !bClosedOnly || 1 == is_closed ) for ( i = 0; i < E_count; /*empty iterator*/ )
    {
      E = E_list[i];
      if ( ++i >= E_count )
      {
        // boundary edge (and the last edge in our list)
        is_closed = 0;
        break;
      }

      if ( E.i != E_list[i].i || E.j != E_list[i].j )
      {
        // boundary edge
        is_closed = 0;
        if ( 2 == is_oriented && 2 == is_manifold )
        {
          bClosedOnly = false;
          break;
        }
        if ( bClosedOnly )
          break; // don't spend time with further testing
        continue;
      }

      if ( E.k == E_list[i].k )
      {
        // opposite face normals along this edge - mesh is not oriented
        is_oriented = 2; 
      }

      if ( ++i >= E_count || E.i != E_list[i].i || E.j != E_list[i].j )
      {
        // two faces share this edge
        continue;
      }

      // three or more faces share this edge - mesh is not oriented manifold
      is_oriented = 2; 
      is_manifold = 2; 
      if ( 0 == is_closed )
      {
        bClosedOnly = false;
        break;
      }

      // Check for more faces sharing this edge.
      for ( i++; i < E_count; i++ )
      {
        if ( E.i != E_list[i].i || E.j != E_list[i].j )
        {
          // the edges E and Eid_list[i] are in different locations
          break;
        }
      }
    }
    if (E_count > 0 && i >= E_count)
    {
      // is_manifold and is_oriented are set correctly
      bClosedOnly = false;
    }

    onfree(E_list);

    break;
  }

  const_cast<ON_Mesh&>(mesh).SetClosed(is_closed);
  if ( !bClosedOnly )
  {
    // is_manifold and is_oriented are set correctly
    if ( 2 == is_manifold )
      is_oriented = 2;
    const_cast<char&>(m_mesh_is_manifold) = is_manifold;
    const_cast<char&>(m_mesh_is_oriented) = is_oriented;
  }
}